

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

void __thiscall
CBlockPolicyEstimator::CBlockPolicyEstimator
          (CBlockPolicyEstimator *this,path *estimation_filepath,bool read_stale_estimates)

{
  path *this_00;
  _Rb_tree_header *p_Var1;
  vector<double,_std::allocator<double>_> *this_01;
  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
  *this_02;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  bool bVar2;
  mapped_type_conflict2 *pmVar3;
  TxConfirmStats *pTVar4;
  FILE *file;
  hours hVar5;
  undefined4 uVar6;
  undefined7 in_register_00000011;
  mapped_type_conflict2 mVar7;
  pointer __p;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  undefined4 in_stack_ffffffffffffff28;
  char cVar8;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *this_03;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *this_04;
  long local_b8;
  rep local_b0;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_a8;
  AutoFile est_file;
  string local_58;
  long local_38;
  
  uVar6 = (undefined4)CONCAT71(in_register_00000011,read_stale_estimates);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_CValidationInterface)._vptr_CValidationInterface =
       (_func_int **)&PTR_UpdatedBlockTip_00a15950;
  this_00 = &this->m_estimation_filepath;
  std::filesystem::__cxx11::path::path(&this_00->super_path,&estimation_filepath->super_path);
  p_Var1 = &(this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex + 8) = 0
  ;
  this->historicalFirst = 0;
  this->historicalBest = 0;
  *(undefined8 *)((long)&(this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex + 0x10)
       = 0;
  (this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->nBestSeenHeight = 0;
  this->firstRecordedHeight = 0;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this_04 = &this->shortStats;
  this_03 = &this->longStats;
  this_01 = &this->buckets;
  p_Var1 = &(this->bucketMap)._M_t._M_impl.super__Rb_tree_header;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->feeStats)._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
  _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
  super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = (TxConfirmStats *)0x0;
  (this->shortStats)._M_t.
  super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
  super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
  super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = (TxConfirmStats *)0x0;
  (this->longStats)._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>
  ._M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
  super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = (TxConfirmStats *)0x0;
  this->trackedTxs = 0;
  this->untrackedTxs = 0;
  (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_02 = &this->bucketMap;
  mVar7 = 0;
  for (est_file.m_file = (FILE *)0x408f400000000000; (double)est_file.m_file <= 10000000.0;
      est_file.m_file = (FILE *)((double)est_file.m_file * 1.05)) {
    std::vector<double,_std::allocator<double>_>::push_back
              (this_01,(value_type_conflict7 *)&est_file);
    pmVar3 = std::
             map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
             ::operator[](this_02,(key_type_conflict3 *)&est_file);
    *pmVar3 = mVar7;
    mVar7 = mVar7 + 1;
  }
  std::vector<double,_std::allocator<double>_>::push_back(this_01,&INF_FEERATE);
  pmVar3 = std::
           map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
           ::operator[](this_02,&INF_FEERATE);
  *pmVar3 = mVar7;
  if ((this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (long)(this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    __assert_fail("bucketMap.size() == buckets.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                  ,0x227,
                  "CBlockPolicyEstimator::CBlockPolicyEstimator(const fs::path &, const bool)");
  }
  pTVar4 = (TxConfirmStats *)operator_new(0xb0);
  TxConfirmStats::TxConfirmStats(pTVar4,this_01,this_02,0x18,0.9952,2);
  est_file.m_file = (FILE *)0x0;
  std::__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::reset
            ((__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             &this->feeStats,pTVar4);
  std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)&est_file);
  pTVar4 = (TxConfirmStats *)operator_new(0xb0);
  TxConfirmStats::TxConfirmStats(pTVar4,this_01,this_02,0xc,0.962,1);
  est_file.m_file = (FILE *)0x0;
  std::__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::reset
            ((__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)this_04,pTVar4
            );
  std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)&est_file);
  pTVar4 = (TxConfirmStats *)operator_new(0xb0);
  TxConfirmStats::TxConfirmStats(pTVar4,this_01,this_02,0x2a,0.99931,0x18);
  est_file.m_file = (FILE *)0x0;
  std::__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::reset
            ((__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)this_03,pTVar4
            );
  std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)&est_file);
  file = fsbridge::fopen((char *)this_00,"rb");
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start._4_4_ = uVar6;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start._0_4_ = in_stack_ffffffffffffff28;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)this_03;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)this_04;
  AutoFile::AutoFile(&est_file,(FILE *)file,data_xor);
  cVar8 = (char)uVar6;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_a8);
  if (est_file.m_file == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&local_58,&this_00->super_path);
    logging_function_00._M_str = "CBlockPolicyEstimator";
    logging_function_00._M_len = 0x15;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
    ;
    source_file_00._M_len = 0x5f;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_00,source_file_00,0x230,ALL,Info,(ConstevalFormatString<1U>)0x6a87a0
               ,&local_58);
  }
  else {
    hVar5 = GetFeeEstimatorFileAge(this);
    if (hVar5.__r < 0x3d || cVar8 != '\0') {
      bVar2 = Read(this,&est_file);
      if (bVar2) goto LAB_0024ef14;
      std::filesystem::__cxx11::path::string(&local_58,&this_00->super_path);
      logging_function._M_str = "CBlockPolicyEstimator";
      logging_function._M_len = 0x15;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x5f;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0x23b,ALL,Info,(ConstevalFormatString<1U>)0x6a8832,
                 &local_58);
    }
    else {
      std::filesystem::__cxx11::path::string(&local_58,&this_00->super_path);
      local_b8 = 0x3c;
      logging_function_01._M_str = "CBlockPolicyEstimator";
      logging_function_01._M_len = 0x15;
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file_01._M_len = 0x5f;
      local_b0 = hVar5.__r;
      LogPrintFormatInternal<std::__cxx11::string,long,long>
                (logging_function_01,source_file_01,0x236,ALL,Info,
                 (ConstevalFormatString<3U>)0x6a87c3,&local_58,&local_b0,&local_b8);
    }
  }
  std::__cxx11::string::~string((string *)&local_58);
LAB_0024ef14:
  AutoFile::~AutoFile(&est_file);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CBlockPolicyEstimator::CBlockPolicyEstimator(const fs::path& estimation_filepath, const bool read_stale_estimates)
    : m_estimation_filepath{estimation_filepath}
{
    static_assert(MIN_BUCKET_FEERATE > 0, "Min feerate must be nonzero");
    size_t bucketIndex = 0;

    for (double bucketBoundary = MIN_BUCKET_FEERATE; bucketBoundary <= MAX_BUCKET_FEERATE; bucketBoundary *= FEE_SPACING, bucketIndex++) {
        buckets.push_back(bucketBoundary);
        bucketMap[bucketBoundary] = bucketIndex;
    }
    buckets.push_back(INF_FEERATE);
    bucketMap[INF_FEERATE] = bucketIndex;
    assert(bucketMap.size() == buckets.size());

    feeStats = std::unique_ptr<TxConfirmStats>(new TxConfirmStats(buckets, bucketMap, MED_BLOCK_PERIODS, MED_DECAY, MED_SCALE));
    shortStats = std::unique_ptr<TxConfirmStats>(new TxConfirmStats(buckets, bucketMap, SHORT_BLOCK_PERIODS, SHORT_DECAY, SHORT_SCALE));
    longStats = std::unique_ptr<TxConfirmStats>(new TxConfirmStats(buckets, bucketMap, LONG_BLOCK_PERIODS, LONG_DECAY, LONG_SCALE));

    AutoFile est_file{fsbridge::fopen(m_estimation_filepath, "rb")};

    if (est_file.IsNull()) {
        LogPrintf("%s is not found. Continue anyway.\n", fs::PathToString(m_estimation_filepath));
        return;
    }

    std::chrono::hours file_age = GetFeeEstimatorFileAge();
    if (file_age > MAX_FILE_AGE && !read_stale_estimates) {
        LogPrintf("Fee estimation file %s too old (age=%lld > %lld hours) and will not be used to avoid serving stale estimates.\n", fs::PathToString(m_estimation_filepath), Ticks<std::chrono::hours>(file_age), Ticks<std::chrono::hours>(MAX_FILE_AGE));
        return;
    }

    if (!Read(est_file)) {
        LogPrintf("Failed to read fee estimates from %s. Continue anyway.\n", fs::PathToString(m_estimation_filepath));
    }
}